

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

PyObject * pybind11::array::raw_array(PyObject *ptr,int ExtraFlags)

{
  npy_api *pnVar1;
  int ExtraFlags_local;
  PyObject *ptr_local;
  
  if (ptr == (PyObject *)0x0) {
    PyErr_SetString(_PyExc_ValueError,"cannot create a pybind11::array from a nullptr");
    ptr_local = (PyObject *)0x0;
  }
  else {
    pnVar1 = detail::npy_api::get();
    ptr_local = (*pnVar1->PyArray_FromAny_)
                          (ptr,(PyObject *)0x0,0,0,ExtraFlags | 0x40,(PyObject *)0x0);
  }
  return ptr_local;
}

Assistant:

static PyObject *raw_array(PyObject *ptr, int ExtraFlags = 0) {
        if (ptr == nullptr) {
            PyErr_SetString(PyExc_ValueError, "cannot create a pybind11::array from a nullptr");
            return nullptr;
        }
        return detail::npy_api::get().PyArray_FromAny_(
            ptr, nullptr, 0, 0, detail::npy_api::NPY_ARRAY_ENSUREARRAY_ | ExtraFlags, nullptr);
    }